

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Tag::SimpleTag::Write(SimpleTag *this,IMkvWriter *writer)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  long lVar5;
  long lVar6;
  long *in_RSI;
  char *in_RDI;
  int64_t stop;
  int64_t start;
  uint64_t simple_tag_size;
  uint64_t payload_size;
  char *in_stack_ffffffffffffffb8;
  IMkvWriter *in_stack_ffffffffffffffc8;
  uint64_t local_8;
  
  uVar2 = EbmlElementSize((uint64)in_stack_ffffffffffffffc8,in_RDI);
  uVar3 = EbmlElementSize((uint64)in_stack_ffffffffffffffc8,in_RDI);
  uVar4 = EbmlMasterElementSize((uint64)in_RDI,(uint64)in_stack_ffffffffffffffb8);
  local_8 = uVar4 + uVar3 + uVar2;
  if (in_RSI != (long *)0x0) {
    lVar5 = (**(code **)(*in_RSI + 8))();
    bVar1 = WriteEbmlMasterElement
                      (in_stack_ffffffffffffffc8,(uint64)in_RDI,(uint64)in_stack_ffffffffffffffb8);
    if (bVar1) {
      bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc8,(uint64)in_RDI,in_stack_ffffffffffffffb8);
      if (bVar1) {
        bVar1 = WriteEbmlElement(in_stack_ffffffffffffffc8,(uint64)in_RDI,in_stack_ffffffffffffffb8)
        ;
        if (bVar1) {
          lVar6 = (**(code **)(*in_RSI + 8))();
          if ((lVar5 <= lVar6) && (lVar6 - lVar5 != local_8)) {
            local_8 = 0;
          }
        }
        else {
          local_8 = 0;
        }
      }
      else {
        local_8 = 0;
      }
    }
    else {
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

uint64_t Tag::SimpleTag::Write(IMkvWriter* writer) const {
  uint64_t payload_size = EbmlElementSize(libwebm::kMkvTagName, tag_name_);

  payload_size += EbmlElementSize(libwebm::kMkvTagString, tag_string_);

  const uint64_t simple_tag_size =
      EbmlMasterElementSize(libwebm::kMkvSimpleTag, payload_size) +
      payload_size;

  if (writer == NULL)
    return simple_tag_size;

  const int64_t start = writer->Position();

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvSimpleTag, payload_size))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvTagName, tag_name_))
    return 0;

  if (!WriteEbmlElement(writer, libwebm::kMkvTagString, tag_string_))
    return 0;

  const int64_t stop = writer->Position();

  if (stop >= start && uint64_t(stop - start) != simple_tag_size)
    return 0;

  return simple_tag_size;
}